

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall
wallet::WalletBatch::WriteActiveScriptPubKeyMan
          (WalletBatch *this,uint8_t type,uint256 *id,bool internal)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined7 in_register_00000009;
  long *plVar2;
  long *plVar3;
  long in_FS_OFFSET;
  bool bVar4;
  string key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  local_80;
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = &DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_;
  plVar3 = &DAT_013b1e58;
  bVar4 = (int)CONCAT71(in_register_00000009,internal) != 0;
  if (bVar4) {
    plVar2 = &DBKeys::ACTIVEINTERNALSPK_abi_cxx11_;
  }
  if (bVar4) {
    plVar3 = &DAT_013b1e78;
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,*plVar2,*plVar3 + *plVar2);
  paVar1 = &local_80.first.field_2;
  local_80.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_58,local_50 + (long)local_58);
  local_80.second = type;
  bVar4 = WriteIC<std::pair<std::__cxx11::string,unsigned_char>,uint256>(this,&local_80,id,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.first._M_dataplus._M_p,local_80.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteActiveScriptPubKeyMan(uint8_t type, const uint256& id, bool internal)
{
    std::string key = internal ? DBKeys::ACTIVEINTERNALSPK : DBKeys::ACTIVEEXTERNALSPK;
    return WriteIC(make_pair(key, type), id);
}